

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_clz(TCGContext_conflict9 *s,int rexw,TCGReg dest,TCGReg arg1,TCGArg arg2,_Bool const_a2
                )

{
  int iVar1;
  _Bool const_a2_local;
  TCGArg arg2_local;
  TCGReg arg1_local;
  TCGReg dest_local;
  int rexw_local;
  TCGContext_conflict9 *s_local;
  
  if (have_lzcnt) {
    tcg_out_modrm(s,rexw + 0x201bd,dest,arg1);
    if (!const_a2) {
      tcg_out_cmov(s,TCG_COND_LTU,rexw,dest,(TCGReg)arg2);
    }
  }
  else {
    tcg_out_modrm(s,rexw + 0x1bd,dest,arg1);
    iVar1 = 0x1f;
    if (rexw != 0) {
      iVar1 = 0x3f;
    }
    tgen_arithi(s,rexw + 6,dest,(long)iVar1,0);
    tcg_out_cmp(s,(ulong)arg1,0,1,rexw);
    tcg_out_cmov(s,TCG_COND_EQ,rexw,dest,(TCGReg)arg2);
  }
  return;
}

Assistant:

static void tcg_out_clz(TCGContext *s, int rexw, TCGReg dest, TCGReg arg1,
                        TCGArg arg2, bool const_a2)
{
    if (have_lzcnt) {
        tcg_out_modrm(s, OPC_LZCNT + rexw, dest, arg1);
        if (const_a2) {
            tcg_debug_assert(arg2 == (rexw ? 64 : 32));
        } else {
            tcg_debug_assert(dest != arg2);
            tcg_out_cmov(s, TCG_COND_LTU, rexw, dest, arg2);
        }
    } else {
        tcg_debug_assert(!const_a2);
        tcg_debug_assert(dest != arg1);
        tcg_debug_assert(dest != arg2);

        /* Recall that the output of BSR is the index not the count.  */
        tcg_out_modrm(s, OPC_BSR + rexw, dest, arg1);
        tgen_arithi(s, ARITH_XOR + rexw, dest, rexw ? 63 : 31, 0);

        /* Since we have destroyed the flags from BSR, we have to re-test.  */
        tcg_out_cmp(s, arg1, 0, 1, rexw);
        tcg_out_cmov(s, TCG_COND_EQ, rexw, dest, arg2);
    }
}